

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

hash_entry_t * insert(hash_table_t *table,hash_key_t key,hash_data_t data,hash_hashvalue_t value)

{
  hash_entry_t *phVar1;
  hash_entry_t *phVar2;
  ulong uVar3;
  ulong uVar4;
  
  phVar1 = table->table;
  uVar3 = (ulong)(long)value % table->table_size;
  uVar4 = uVar3;
  do {
    phVar2 = phVar1 + uVar4;
    if (phVar1[uVar4].status < 2) {
      phVar2->key = key;
      phVar2->data = data;
      phVar2->hash_value = value;
      phVar2->status = 2;
      break;
    }
    uVar4 = uVar4 + 1;
    if (uVar4 == table->table_size) {
      uVar4 = 0;
    }
  } while (uVar4 != uVar3);
  if (phVar1 == (hash_entry_t *)0x0) {
    phVar2 = (hash_entry_t *)0x0;
  }
  else {
    phVar1 = table->head;
    phVar2->next = phVar1;
    phVar2->prev = (hash_entry_t *)0x0;
    if (phVar1 != (hash_entry_t *)0x0) {
      phVar1->prev = phVar2;
    }
    table->head = phVar2;
    table->entry_count = table->entry_count + 1;
  }
  return phVar2;
}

Assistant:

static hash_entry_t *insert(hash_table_t *table, hash_key_t key, hash_data_t data, hash_hashvalue_t value)
{
   unsigned long index = (unsigned long)value % table->table_size;
   unsigned long startindex = index;

   hash_entry_t *entry = NULL;
   do {
      entry = table->table + index;
      if (entry->status == EMPTY || entry->status == TOMBSTONE) {
         entry->key = key;
         entry->data = data;
         entry->hash_value = value;
         entry->status = INUSE;
         break;
      }
      index++;
      if (index == table->table_size)
         index = 0;
   } while (index != startindex);

   if (!entry)
      return NULL;

   entry->next = table->head;
   entry->prev = NULL;
   if (table->head)
      table->head->prev = entry;
   table->head = entry;
   table->entry_count++;         

   return entry;
}